

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O1

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  long *plVar1;
  heterovector hetvec;
  _Variadic_union<int,_float,_double> _Var2;
  pointer pvVar3;
  
  _Var2 = (_Variadic_union<int,_float,_double>)0x0;
  pvVar3 = (pointer)0x0;
  heterovector::append
            ((heterovector *)&stack0xffffffffffffffd8,(variant<int,_float,_double>)ZEXT816(0));
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = pvVar3;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)_Var2;
  heterovector::append((heterovector *)&stack0xffffffffffffffd8,ele);
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = pvVar3;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Uninitialized<int,_true>)(_Uninitialized<int,_true>)_Var2;
  heterovector::append((heterovector *)&stack0xffffffffffffffd8,ele_00);
  plVar1 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,(int)((ulong)((long)pvVar3 - (long)_Var2) >> 4))
  ;
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (_Var2 != (_Variadic_union<int,_float,_double>)0x0) {
    operator_delete((void *)_Var2,-(long)_Var2);
  }
  return 0;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3.1);
    hetvec.append(1);
    hetvec.append(0);

    std::cout << hetvec.size() << std::endl;

    return 0;
}